

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

uint32_t unique(uint16_t *out,uint32_t len)

{
  uint32_t i;
  uint32_t pos;
  uint32_t len_local;
  uint16_t *out_local;
  
  pos = 1;
  for (i = 1; i < len; i = i + 1) {
    if (out[i] != out[i - 1]) {
      out[pos] = out[i];
      pos = pos + 1;
    }
  }
  return pos;
}

Assistant:

CROARING_UNTARGET_AVX2

// working in-place, this function overwrites the repeated values
// could be avoided?
static inline uint32_t unique(uint16_t *out, uint32_t len) {
    uint32_t pos = 1;
    for (uint32_t i = 1; i < len; ++i) {
        if (out[i] != out[i - 1]) {
            out[pos++] = out[i];
        }
    }
    return pos;
}